

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

void __thiscall kj::ArrayInputStream::skip(ArrayInputStream *this,size_t bytes)

{
  ulong uVar1;
  Fault f;
  Fault local_20;
  
  uVar1 = (this->array).size_;
  if (uVar1 < bytes) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[36]>
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
               ,0x101,FAILED,"array.size() >= bytes","\"ArrayInputStream ended prematurely.\"",
               (char (*) [36])"ArrayInputStream ended prematurely.");
    bytes = (this->array).size_;
    _::Debug::Fault::~Fault(&local_20);
    uVar1 = (this->array).size_;
  }
  (this->array).ptr = (this->array).ptr + bytes;
  (this->array).size_ = uVar1 - bytes;
  return;
}

Assistant:

void ArrayInputStream::skip(size_t bytes) {
  KJ_REQUIRE(array.size() >= bytes, "ArrayInputStream ended prematurely.") {
    bytes = array.size();
    break;
  }
  array = array.slice(bytes, array.size());
}